

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode pubkey_pem_to_der(char *pem,uchar **der,size_t *der_len)

{
  CURLcode CVar1;
  char *pcVar2;
  long lVar3;
  undefined1 local_70 [8];
  dynbuf pbuf;
  CURLcode result;
  size_t pem_len;
  size_t pem_count;
  char *end_pos;
  char *begin_pos;
  size_t *der_len_local;
  uchar **der_local;
  char *pem_local;
  
  if (pem == (char *)0x0) {
    pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    Curl_dyn_init((dynbuf *)local_70,0x100000);
    pcVar2 = strstr(pem,"-----BEGIN PUBLIC KEY-----");
    if (pcVar2 == (char *)0x0) {
      pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
    else {
      lVar3 = (long)pcVar2 - (long)pem;
      if ((lVar3 == 0) || (pem[lVar3 + -1] == '\n')) {
        pem_len = lVar3 + 0x1a;
        pcVar2 = strstr(pem + pem_len,"\n-----END PUBLIC KEY-----");
        if (pcVar2 == (char *)0x0) {
          pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
        else {
          for (; pem_len < (ulong)((long)pcVar2 - (long)pem); pem_len = pem_len + 1) {
            if ((pem[pem_len] != '\n') && (pem[pem_len] != '\r')) {
              CVar1 = Curl_dyn_addn((dynbuf *)local_70,pem + pem_len,1);
              if (CVar1 != CURLE_OK) {
                return CVar1;
              }
              pbuf.toobig._4_4_ = 0;
            }
          }
          pcVar2 = Curl_dyn_ptr((dynbuf *)local_70);
          pbuf.toobig._4_4_ = Curl_base64_decode(pcVar2,der,der_len);
          Curl_dyn_free((dynbuf *)local_70);
          pem_local._4_4_ = pbuf.toobig._4_4_;
        }
      }
      else {
        pem_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
      }
    }
  }
  return pem_local._4_4_;
}

Assistant:

static CURLcode pubkey_pem_to_der(const char *pem,
                                  unsigned char **der, size_t *der_len)
{
  char *begin_pos, *end_pos;
  size_t pem_count, pem_len;
  CURLcode result;
  struct dynbuf pbuf;

  /* if no pem, exit. */
  if(!pem)
    return CURLE_BAD_CONTENT_ENCODING;

  Curl_dyn_init(&pbuf, MAX_PINNED_PUBKEY_SIZE);

  begin_pos = strstr(pem, "-----BEGIN PUBLIC KEY-----");
  if(!begin_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_count = begin_pos - pem;
  /* Invalid if not at beginning AND not directly following \n */
  if(0 != pem_count && '\n' != pem[pem_count - 1])
    return CURLE_BAD_CONTENT_ENCODING;

  /* 26 is length of "-----BEGIN PUBLIC KEY-----" */
  pem_count += 26;

  /* Invalid if not directly following \n */
  end_pos = strstr(pem + pem_count, "\n-----END PUBLIC KEY-----");
  if(!end_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_len = end_pos - pem;

  /*
   * Here we loop through the pem array one character at a time between the
   * correct indices, and place each character that is not '\n' or '\r'
   * into the stripped_pem array, which should represent the raw base64 string
   */
  while(pem_count < pem_len) {
    if('\n' != pem[pem_count] && '\r' != pem[pem_count]) {
      result = Curl_dyn_addn(&pbuf, &pem[pem_count], 1);
      if(result)
        return result;
    }
    ++pem_count;
  }

  result = Curl_base64_decode(Curl_dyn_ptr(&pbuf), der, der_len);

  Curl_dyn_free(&pbuf);

  return result;
}